

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_msb.hpp
# Opt level: O0

uint32_t ans_msb_exception_bytes(uint32_t x)

{
  uint32_t x_local;
  undefined4 local_4;
  
  if (x < 0x101) {
    local_4 = 0;
  }
  else if (x < 0x201) {
    local_4 = 1;
  }
  else if (x < 0x301) {
    local_4 = 2;
  }
  else {
    local_4 = 3;
  }
  return local_4;
}

Assistant:

uint32_t ans_msb_exception_bytes(uint32_t x)
{
    if (x <= 256)
        return 0;
    if (x <= 512)
        return 1;
    if (x <= 768)
        return 2;
    return 3;
}